

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

void __thiscall Logger::Logger(Logger *this)

{
  char *__s;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Logger *local_10;
  Logger *this_local;
  
  local_10 = this;
  Tools::getInstance();
  __s = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  std::operator+(&this->loggerPath,&local_30,"/.stn/logs");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::ofstream::ofstream(&this->loggerFile);
  return;
}

Assistant:

Logger() {}